

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O2

bool __thiscall pbrt::syntactic::ParamSet::hasParam3f(ParamSet *this,string *name)

{
  bool bVar1;
  long local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  _Base_ptr local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  findParam<float>((ParamSet *)&local_38,(string *)this);
  if (local_38 == 0) {
    bVar1 = false;
  }
  else {
    findParam<float>((ParamSet *)&local_28,(string *)this);
    bVar1 = *(long *)(local_28 + 1) - (long)local_28->_M_right == 0xc;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  return bVar1;
}

Assistant:

bool hasParam3f(const std::string &name) const {
        return (bool)findParam<float>(name) && findParam<float>(name)->size() == 3;
      }